

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

Var Js::JavascriptProxy::GetName(ScriptContext *requestContext,PropertyId propertyId)

{
  PropertyRecord *propertyRecord;
  JavascriptSymbol *pJVar1;
  PropertyString *pPVar2;
  
  propertyRecord = ThreadContext::GetPropertyName(requestContext->threadContext,propertyId);
  if (propertyRecord->isSymbol == true) {
    pJVar1 = ScriptContext::GetSymbol(requestContext,propertyRecord);
    return pJVar1;
  }
  pPVar2 = ScriptContext::GetPropertyString(requestContext,propertyRecord);
  return pPVar2;
}

Assistant:

Var JavascriptProxy::GetName(ScriptContext* requestContext, PropertyId propertyId)
    {
        const PropertyRecord* propertyRecord = requestContext->GetThreadContext()->GetPropertyName(propertyId);
        Var name;
        if (propertyRecord->IsSymbol())
        {
            name = requestContext->GetSymbol(propertyRecord);
        }
        else
        {
            name = requestContext->GetPropertyString(propertyRecord);
        }
        return name;
    }